

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LookupTable.h
# Opt level: O0

IDTy __thiscall dg::PointerIDLookupTable::getOrCreate(PointerIDLookupTable *this,Pointer *ptr)

{
  value_type *in_RSI;
  vector<dg::pta::Pointer,_std::allocator<dg::pta::Pointer>_> *in_RDI;
  Pointer *unaff_retaddr;
  IDTy res;
  HashMapImpl<dg::Offset,_unsigned_long,_std::unordered_map<dg::Offset,_unsigned_long,_std::hash<dg::Offset>,_std::equal_to<dg::Offset>,_std::allocator<std::pair<const_dg::Offset,_unsigned_long>_>_>_>
  *in_stack_00000020;
  vector<dg::pta::Pointer,_std::allocator<dg::pta::Pointer>_> *this_00;
  unordered_map<dg::pta::PSNode_*,_dg::STLHashMap<dg::Offset,_unsigned_long>,_std::hash<dg::pta::PSNode_*>,_std::equal_to<dg::pta::PSNode_*>,_std::allocator<std::pair<dg::pta::PSNode_*const,_dg::STLHashMap<dg::Offset,_unsigned_long>_>_>_>
  *local_8;
  
  this_00 = in_RDI;
  local_8 = (unordered_map<dg::pta::PSNode_*,_dg::STLHashMap<dg::Offset,_unsigned_long>,_std::hash<dg::pta::PSNode_*>,_std::equal_to<dg::pta::PSNode_*>,_std::allocator<std::pair<dg::pta::PSNode_*const,_dg::STLHashMap<dg::Offset,_unsigned_long>_>_>_>
             *)get((PointerIDLookupTable *)res,unaff_retaddr);
  if (local_8 ==
      (unordered_map<dg::pta::PSNode_*,_dg::STLHashMap<dg::Offset,_unsigned_long>,_std::hash<dg::pta::PSNode_*>,_std::equal_to<dg::pta::PSNode_*>,_std::allocator<std::pair<dg::pta::PSNode_*const,_dg::STLHashMap<dg::Offset,_unsigned_long>_>_>_>
       *)0x0) {
    std::vector<dg::pta::Pointer,_std::allocator<dg::pta::Pointer>_>::push_back(this_00,in_RSI);
    local_8 = (unordered_map<dg::pta::PSNode_*,_dg::STLHashMap<dg::Offset,_unsigned_long>,_std::hash<dg::pta::PSNode_*>,_std::equal_to<dg::pta::PSNode_*>,_std::allocator<std::pair<dg::pta::PSNode_*const,_dg::STLHashMap<dg::Offset,_unsigned_long>_>_>_>
               *)std::vector<dg::pta::Pointer,_std::allocator<dg::pta::Pointer>_>::size
                           (in_RDI + 0x38);
    std::
    unordered_map<dg::pta::PSNode_*,_dg::STLHashMap<dg::Offset,_unsigned_long>,_std::hash<dg::pta::PSNode_*>,_std::equal_to<dg::pta::PSNode_*>,_std::allocator<std::pair<dg::pta::PSNode_*const,_dg::STLHashMap<dg::Offset,_unsigned_long>_>_>_>
    ::operator[](local_8,(key_type *)in_RDI);
    HashMapImpl<dg::Offset,_unsigned_long,_std::unordered_map<dg::Offset,_unsigned_long,_std::hash<dg::Offset>,_std::equal_to<dg::Offset>,_std::allocator<std::pair<const_dg::Offset,_unsigned_long>_>_>_>
    ::put(in_stack_00000020,(Offset *)this,(unsigned_long)ptr);
  }
  return (IDTy)local_8;
}

Assistant:

IDTy getOrCreate(const Pointer &ptr) {
        auto res = get(ptr);
        if (res != 0)
            return res;

        _idToPtr.push_back(ptr);
        res = _idToPtr.size();
#ifndef NDEBUG
        bool r =
#endif
                _ptrToID[ptr.target].put(ptr.offset, res);

        assert(r && "Duplicated ID!");
        assert(get(res) == ptr);
        assert(res == get(ptr));
        assert(res > 0 && "ID must always be greater than 0");
        return res;
    }

    IDTy get(const Pointer &ptr) const {
        auto it = _ptrToID.find(ptr.target);
        if (it == _ptrToID.end()) {
            return 0; // invalid ID
        }
        auto it2 = it->second.find(ptr.offset);
        if (it2 == it->second.end())
            return 0;
        return it2->second;
    }

    const Pointer &get(IDTy id) const {
        assert(id - 1 < _idToPtr.size());
        return _idToPtr[id - 1];
    }

  private:
    // PSNode -> (Offset -> id)
    // Not space efficient, but we need mainly the time efficiency here...
    // NOTE: unfortunately, atm, we cannot use the id of the target for hashing
    // because it would break repeated runs of the analysis
    // as multiple graphs will contain nodes with the same id
    // (and resetting the state is really painful, I tried that,
    // but just didn't succeed).
    PtrToIDMap _ptrToID;
    std::vector<Pointer> _idToPtr; // starts from 0 (pointer = idVector[id - 1])
}